

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.c
# Opt level: O3

void lyplg_type_free_bits(ly_ctx *ctx,lyd_value *value)

{
  long lVar1;
  
  lydict_remove(ctx,value->_canonical);
  value->_canonical = (char *)0x0;
  free((value->field_2).dyn_mem);
  lVar1 = *(long *)((long)&value->field_2 + 8);
  if (lVar1 != 0) {
    free((void *)(lVar1 + -8));
    return;
  }
  return;
}

Assistant:

LIBYANG_API_DEF void
lyplg_type_free_bits(const struct ly_ctx *ctx, struct lyd_value *value)
{
    struct lyd_value_bits *val;

    lydict_remove(ctx, value->_canonical);
    value->_canonical = NULL;
    LYD_VALUE_GET(value, val);
    if (val) {
        free(val->bitmap);
        LY_ARRAY_FREE(val->items);
        LYPLG_TYPE_VAL_INLINE_DESTROY(val);
    }
}